

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

char * getSelectionString(Atom selection)

{
  long lVar1;
  uint uVar2;
  unsigned_long uVar3;
  int iVar4;
  Window WVar5;
  Atom *pAVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  size_t __size;
  long lVar10;
  bool bVar11;
  char *data;
  uint local_200;
  int actualFormat;
  long local_1f8;
  Atom local_1f0;
  unsigned_long itemCount;
  Atom actualType;
  Atom local_1d8 [2];
  Atom local_1c8;
  unsigned_long bytesAfter;
  Atom local_1b8;
  XEvent notification;
  XEvent dummy;
  
  local_1d8[0] = _glfw.x11.UTF8_STRING;
  local_1b8 = 0x1f;
  bVar11 = _glfw.x11.PRIMARY != selection;
  WVar5 = (*_glfw.x11.xlib.GetSelectionOwner)(_glfw.x11.display,selection);
  pcVar7 = *(char **)((long)_glfw.x11.keynames + (ulong)bVar11 * 8 + -0x10);
  if (WVar5 != _glfw.x11.helperWindowHandle) {
    lVar1 = (ulong)bVar11 * 8;
    lVar10 = lVar1 + 0x206a0;
    free(pcVar7);
    *(undefined8 *)((long)_glfw.x11.keynames + lVar1 + -0x10) = 0;
    pAVar6 = local_1d8;
    uVar9 = 1;
    local_1c8 = selection;
    local_1f8 = lVar10;
    do {
      local_1f0 = *pAVar6;
      (*_glfw.x11.xlib.ConvertSelection)
                (_glfw.x11.display,selection,local_1f0,_glfw.x11.GLFW_SELECTION,
                 _glfw.x11.helperWindowHandle,0);
      while (iVar4 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&notification),
            iVar4 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.time != 0) {
        (*_glfw.x11.xlib.CheckIfEvent)
                  (_glfw.x11.display,&dummy,isSelPropNewValueNotify,(XPointer)&notification);
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                   0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                   (uchar **)&data);
        if (actualType == _glfw.x11.INCR) {
          __size = 1;
          pcVar7 = (char *)0x0;
          local_200 = uVar9;
          while( true ) {
            while (iVar4 = (*_glfw.x11.xlib.CheckIfEvent)
                                     (_glfw.x11.display,&dummy,isSelPropNewValueNotify,
                                      (XPointer)&notification), iVar4 == 0) {
              waitForEvent((double *)0x0);
            }
            (*_glfw.x11.xlib.Free)(data);
            (*_glfw.x11.xlib.GetWindowProperty)
                      (_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                       0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                       (uchar **)&data);
            selection = local_1c8;
            uVar3 = itemCount;
            if (itemCount == 0) break;
            __size = __size + itemCount;
            pcVar7 = (char *)realloc(pcVar7,__size);
            pcVar7[~uVar3 + __size] = '\0';
            strcat(pcVar7,data);
          }
          if (local_1f0 == 0x1f) {
            pcVar8 = convertLatin1toUTF8(pcVar7);
            lVar10 = local_1f8;
            *(char **)((long)&_glfw.initialized + local_1f8) = pcVar8;
            free(pcVar7);
            uVar9 = local_200;
          }
          else {
            *(char **)((long)&_glfw.initialized + local_1f8) = pcVar7;
            lVar10 = local_1f8;
            uVar9 = local_200;
          }
        }
        else if (actualType == local_1f0) {
          if (local_1f0 == 0x1f) {
            pcVar7 = convertLatin1toUTF8(data);
          }
          else {
            pcVar7 = _glfw_strdup(data);
          }
          *(char **)((long)&_glfw.initialized + lVar10) = pcVar7;
        }
        (*_glfw.x11.xlib.Free)(data);
        pcVar7 = *(char **)((long)&_glfw.initialized + lVar10);
        if (pcVar7 != (char *)0x0) {
          return pcVar7;
        }
      }
      pAVar6 = &local_1b8;
      uVar2 = uVar9 & 1;
      uVar9 = 0;
    } while (uVar2 != 0);
    pcVar7 = *(char **)((long)&_glfw.initialized + lVar10);
    if (pcVar7 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
      pcVar7 = *(char **)((long)&_glfw.initialized + lVar10);
    }
  }
  return pcVar7;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}